

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_polycurve.cpp
# Opt level: O1

ON_Curve * __thiscall ON_PolyCurve::DuplicateCurve(ON_PolyCurve *this)

{
  uint capacity;
  int iVar1;
  ON_PolyCurve *this_00;
  undefined4 extraout_var;
  double *t;
  ON_Curve *pOVar2;
  ulong uVar3;
  
  capacity = (this->m_segment).super_ON_SimpleArray<ON_Curve_*>.m_count;
  this_00 = (ON_PolyCurve *)operator_new(0x40);
  ON_PolyCurve(this_00,capacity);
  ON_Object::CopyUserData((ON_Object *)this_00,(ON_Object *)this);
  if (0 < (int)capacity) {
    uVar3 = 0;
    do {
      if ((long)uVar3 < (long)(this->m_segment).super_ON_SimpleArray<ON_Curve_*>.m_count) {
        pOVar2 = (this->m_segment).super_ON_SimpleArray<ON_Curve_*>.m_a[uVar3];
      }
      else {
        pOVar2 = (ON_Curve *)0x0;
      }
      if (pOVar2 != (ON_Curve *)0x0) {
        iVar1 = (*(pOVar2->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x24])();
        ON_Curve::DestroyCurveTree((ON_Curve *)this_00);
        Insert(this_00,(this_00->m_segment).super_ON_SimpleArray<ON_Curve_*>.m_count,
               (ON_Curve *)CONCAT44(extraout_var,iVar1));
      }
      uVar3 = uVar3 + 1;
    } while (capacity != uVar3);
  }
  if (capacity == (this_00->m_segment).super_ON_SimpleArray<ON_Curve_*>.m_count) {
    if ((this->m_t).m_count < 1) {
      t = (double *)0x0;
    }
    else {
      t = (this->m_t).m_a;
    }
    SetParameterization(this_00,t);
  }
  return &this_00->super_ON_Curve;
}

Assistant:

ON_Curve* ON_PolyCurve::DuplicateCurve() const
{
	// Call DuplicateCurve on each segment to construct duplicate curve.
	int cnt = Count();
	ON_PolyCurve* dup_crv = new ON_PolyCurve( cnt );
  dup_crv->CopyUserData(*this);
	for( int i=0; i<cnt; i++){
		const ON_Curve* seg = SegmentCurve(i);
		if(seg)
			dup_crv->Append( seg->DuplicateCurve() );
	}	
	if( cnt == dup_crv->Count() )
		dup_crv->SetParameterization( m_t);
	return dup_crv;
}